

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputAESEncodeStream.cpp
# Opt level: O1

LongBufferSizeType __thiscall
OutputAESEncodeStream::Write(OutputAESEncodeStream *this,Byte *inBuffer,LongBufferSizeType inSize)

{
  uchar *ibuf;
  pointer pcVar1;
  uchar *__dest;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  string *psVar5;
  size_t __n;
  LongBufferSizeType __n_00;
  PDFDate currentTime;
  MD5Generator md5;
  string local_140;
  PDFDate local_11c;
  MD5Generator local_f8;
  
  if (this->mTargetStream == (IByteWriterWithPosition *)0x0) {
    inSize = 0;
  }
  else {
    if (this->mWroteIV == false) {
      MD5Generator::MD5Generator(&local_f8);
      PDFDate::PDFDate(&local_11c);
      PDFDate::SetToCurrentTime(&local_11c);
      PDFDate::ToString_abi_cxx11_(&local_140,&local_11c);
      MD5Generator::Accumulate(&local_f8,&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      psVar5 = MD5Generator::ToStringAsString_abi_cxx11_(&local_f8);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      uVar2 = *(undefined4 *)(pcVar1 + 4);
      uVar3 = *(undefined4 *)(pcVar1 + 8);
      uVar4 = *(undefined4 *)(pcVar1 + 0xc);
      *(undefined4 *)this->mIV = *(undefined4 *)pcVar1;
      *(undefined4 *)(this->mIV + 4) = uVar2;
      *(undefined4 *)(this->mIV + 8) = uVar3;
      *(undefined4 *)(this->mIV + 0xc) = uVar4;
      (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                (this->mTargetStream,this->mIV,0x10);
      this->mWroteIV = true;
      PDFDate::~PDFDate(&local_11c);
      MD5Generator::~MD5Generator(&local_f8);
    }
    if (inSize != 0) {
      ibuf = this->mIn;
      __n_00 = inSize;
      do {
        __dest = this->mInIndex;
        if (((long)__dest - (long)ibuf) + __n_00 < 0x10) {
          memcpy(__dest,inBuffer + (inSize - __n_00),__n_00);
          this->mInIndex = this->mInIndex + __n_00;
          __n_00 = 0;
        }
        else {
          __n = 0x10 - ((long)__dest - (long)ibuf);
          memcpy(__dest,inBuffer + (inSize - __n_00),__n);
          aes_cbc_encrypt(ibuf,this->mOut,0x10,this->mIV,(this->mEncrypt).cx);
          (*(this->mTargetStream->super_IByteWriter)._vptr_IByteWriter[2])
                    (this->mTargetStream,this->mOut,0x10);
          this->mInIndex = ibuf;
          __n_00 = __n_00 - __n;
        }
      } while (__n_00 != 0);
    }
  }
  return inSize;
}

Assistant:

LongBufferSizeType OutputAESEncodeStream::Write(const IOBasicTypes::Byte* inBuffer, IOBasicTypes::LongBufferSizeType inSize) 
{
	if (!mTargetStream)
		return 0;

	// write IV if didn't write yet
	if (!mWroteIV) {
		// create IV and write it to output file [use existing PDFDate]
		MD5Generator md5;
		// encode current time
		PDFDate currentTime;
		currentTime.SetToCurrentTime();
		md5.Accumulate(currentTime.ToString());
		memcpy(mIV, (const unsigned char*)md5.ToStringAsString().c_str(), AES_BLOCK_SIZE); // md5 should give us the desired 16 bytes

																						   // now write mIV to the output stream
		mTargetStream->Write(mIV, AES_BLOCK_SIZE);
		mWroteIV = true;
	}


	// input and existing buffer sizes smaller than block size, so just copy and return


	IOBasicTypes::LongBufferSizeType left = inSize;

	while (left > 0) {
		// if what's left is not enough to finish block, just copy and stop
		if (left + (mInIndex - mIn) < AES_BLOCK_SIZE) {
			memcpy(mInIndex, inBuffer + inSize - left, left);
			mInIndex += left;
			left = 0;
		}
		else {
			// otherwise, enough to fill block. fill, encode and continue
			IOBasicTypes::LongBufferSizeType remainder = AES_BLOCK_SIZE - (mInIndex - mIn);
			memcpy(mInIndex, inBuffer + inSize - left, remainder);

			// encrypt
			mEncrypt.cbc_encrypt(mIn, mOut, AES_BLOCK_SIZE, mIV);
			mTargetStream->Write(mOut, AES_BLOCK_SIZE);
			mInIndex = mIn;
			left -= remainder;
		}
	}

	return inSize;
}